

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowingArray.cpp
# Opt level: O0

GrowingUint32HeapArray *
JsUtil::GrowingArray<unsigned_int,_Memory::HeapAllocator>::Create(uint32 _length)

{
  HeapAllocator *alloc;
  GrowingArray<unsigned_int,_Memory::HeapAllocator> *this;
  TrackAllocData local_38;
  uint32 local_c;
  uint32 _length_local;
  
  local_c = _length;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&GrowingArray<unsigned_int,Memory::HeapAllocator>::typeinfo,0,
             0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/GrowingArray.cpp"
             ,0xe);
  alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_38);
  this = (GrowingArray<unsigned_int,_Memory::HeapAllocator> *)
         new<Memory::HeapAllocator>(0x18,alloc,0x350bd0);
  GrowingArray(this,&Memory::HeapAllocator::Instance,local_c);
  return this;
}

Assistant:

GrowingUint32HeapArray* GrowingArray<uint32, HeapAllocator>::Create(uint32 _length)
    {
        return HeapNew(GrowingUint32HeapArray, &HeapAllocator::Instance, _length);
    }